

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

double __thiscall r_exec::View::update_vis(View *this)

{
  Atom *this_00;
  float fVar1;
  float local_3c;
  Atom local_1c [4];
  double local_18;
  double new_vis;
  View *this_local;
  
  new_vis = (double)this;
  if ((this->vis_changes != 0) && ((this->acc_vis != 0.0 || (NAN(this->acc_vis))))) {
    fVar1 = get_vis(this);
    local_3c = (float)this->vis_changes;
    local_18 = (double)(fVar1 + this->acc_vis / local_3c);
    if (0.0 <= local_18) {
      if (1.0 < local_18) {
        local_18 = 1.0;
      }
    }
    else {
      local_18 = 0.0;
    }
    r_code::Atom::Float((float)local_18);
    this_00 = r_code::View::code(&this->super_View,8);
    r_code::Atom::operator=(this_00,local_1c);
    r_code::Atom::~Atom(local_1c);
  }
  this->acc_vis = 0.0;
  this->vis_changes = 0;
  fVar1 = get_vis(this);
  return (double)fVar1;
}

Assistant:

double View::update_vis()
{
    if (vis_changes > 0 && acc_vis != 0) {
        double new_vis = get_vis() + acc_vis / vis_changes;

        if (new_vis < 0) {
            new_vis = 0;
        } else if (new_vis > 1) {
            new_vis = 1;
        }

        code(GRP_VIEW_VIS) = r_code::Atom::Float(new_vis);
    }

    acc_vis = 0;
    vis_changes = 0;
    return get_vis();
}